

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall tst_SerialiserCommon::basicSaveLoadData(tst_SerialiserCommon *this,QObject *parent)

{
  QTestData *pQVar1;
  QStringListModel *this_00;
  QStandardItemModel *pQVar2;
  QAbstractItemModel *local_c8;
  QAbstractItemModel *local_c0;
  QAbstractItemModel *local_b8;
  QAbstractItemModel *local_b0;
  QStandardItemModel *local_a8;
  QAbstractItemModel *local_a0;
  QStandardItemModel *local_98;
  QAbstractItemModel *local_90;
  QAbstractItemModel *local_88;
  QAbstractItemModel *local_80;
  QAbstractItemModel *local_78;
  QAbstractItemModel *local_70;
  QStandardItemModel *local_68;
  QAbstractItemModel *local_60;
  QStandardItemModel *local_58;
  QAbstractItemModel *local_50;
  QAbstractItemModel *local_48;
  QAbstractItemModel *local_40 [3];
  QStringListModel *local_28;
  QAbstractItemModel *local_20;
  QObject *local_18;
  QObject *parent_local;
  tst_SerialiserCommon *this_local;
  
  local_18 = parent;
  parent_local = (QObject *)this;
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QAbstractItemModel*>("destinationModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  local_20 = createStringModel(this,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_20);
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,local_18);
  local_28 = this_00;
  ::operator<<(pQVar1,(QAbstractItemModel **)&local_28);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  local_40[0] = createStringModel(this,local_18);
  pQVar1 = ::operator<<(pQVar1,local_40);
  local_48 = createStringModel(this,local_18);
  ::operator<<(pQVar1,&local_48);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_50 = createComplexModel(this,false,false,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_50);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,local_18);
  local_58 = pQVar2;
  ::operator<<(pQVar1,(QAbstractItemModel **)&local_58);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_60 = createComplexModel(this,false,true,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_60);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,local_18);
  local_68 = pQVar2;
  ::operator<<(pQVar1,(QAbstractItemModel **)&local_68);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_70 = createComplexModel(this,false,false,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_70);
  local_78 = createComplexModel(this,false,false,local_18);
  ::operator<<(pQVar1,&local_78);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles Overwrite");
  local_80 = createComplexModel(this,false,true,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_80);
  local_88 = createComplexModel(this,false,true,local_18);
  ::operator<<(pQVar1,&local_88);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role");
  local_90 = createComplexModel(this,true,false,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_90);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,local_18);
  local_98 = pQVar2;
  ::operator<<(pQVar1,(QAbstractItemModel **)&local_98);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_a0 = createComplexModel(this,true,true,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_a0);
  pQVar2 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar2,local_18);
  local_a8 = pQVar2;
  ::operator<<(pQVar1,(QAbstractItemModel **)&local_a8);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role Overwrite");
  local_b0 = createComplexModel(this,true,false,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_b0);
  local_b8 = createComplexModel(this,true,false,local_18);
  ::operator<<(pQVar1,&local_b8);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles Overwrite");
  local_c0 = createComplexModel(this,true,true,local_18);
  pQVar1 = ::operator<<(pQVar1,&local_c0);
  local_c8 = createComplexModel(this,true,true,local_18);
  ::operator<<(pQVar1,&local_c8);
  return;
}

Assistant:

void tst_SerialiserCommon::basicSaveLoadData(QObject *parent)
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(parent))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(parent));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(parent)) << createStringModel(parent);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                                 << createComplexModel(false, false, parent);
    QTest::newRow("Table Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                                 << createComplexModel(false, true, parent);
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                                << createComplexModel(true, false, parent);
    QTest::newRow("Tree Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                                << createComplexModel(true, true, parent);
#endif
}